

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InvalidPattern * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidPattern,slang::ast::Pattern_const*&>
          (BumpAllocator *this,Pattern **args)

{
  Pattern *pPVar1;
  InvalidPattern *pIVar2;
  
  pIVar2 = (InvalidPattern *)allocate(this,0x28,8);
  pPVar1 = *args;
  (pIVar2->super_Pattern).kind = Invalid;
  (pIVar2->super_Pattern).sourceRange.endLoc = (SourceLocation)0x0;
  (pIVar2->super_Pattern).syntax = (SyntaxNode *)0x0;
  (pIVar2->super_Pattern).sourceRange.startLoc = (SourceLocation)0x0;
  pIVar2->child = pPVar1;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }